

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunConstantPropagation(ExpressionContext *ctx,VmModule *module,VmValue *value,bool nested)

{
  uint *this;
  uint uVar1;
  int iVar2;
  VmValue *pVVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  VmValue **ppVVar7;
  VmConstant **ppVVar8;
  VmConstant *pVVar9;
  VmValue *pVVar10;
  uint i_1;
  SynBase *pSVar11;
  uint i;
  VmValueType VVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  longlong lVar16;
  Allocator *pAVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  VmConstant *local_150;
  SmallArray<VmConstant_*,_32U> consts;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar14 = value->typeID;
  if (uVar14 != 2) {
    if (uVar14 == 3) {
      pVVar10 = (VmValue *)value[1].comment.end;
      while (pVVar10 != (VmValue *)0x0) {
        pVVar3 = pVVar10[1].users.little[0];
        RunConstantPropagation(ctx,module,pVVar10,nested);
        pVVar10 = pVVar3;
      }
      return;
    }
    if (uVar14 != 4) {
      return;
    }
    pVVar10 = (VmValue *)value[1].source;
    while (pVVar10 != (VmValue *)0x0) {
      pVVar3 = (VmValue *)pVVar10[1].comment.begin;
      RunConstantPropagation(ctx,module,pVVar10,nested);
      pVVar10 = pVVar3;
    }
    return;
  }
  VVar12 = (value->type).type;
  uVar14 = (value->type).size;
  if (((uVar14 != 4 || VVar12 != VM_TYPE_INT) && (VVar12 != VM_TYPE_POINTER)) &&
     ((VVar12 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || uVar14 != 8)) {
    return;
  }
  consts.allocator = module->allocator;
  consts.data = consts.little;
  consts.count = 0;
  consts.max = 0x20;
  this = &value[1].typeID;
  for (VVar12 = VM_TYPE_VOID; VVar12 < value[1].type.type; VVar12 = VVar12 + VM_TYPE_INT) {
    ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,VVar12);
    pVVar9 = (VmConstant *)*ppVVar7;
    if ((pVVar9 == (VmConstant *)0x0) || ((pVVar9->super_VmValue).typeID != 1)) {
      local_150 = (VmConstant *)0x0;
      if (!nested) goto switchD_0024edc0_caseD_8;
      ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,VVar12);
      RunConstantPropagation(ctx,module,*ppVVar7,true);
      ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,VVar12);
      pVVar9 = (VmConstant *)*ppVVar7;
      if ((pVVar9 == (VmConstant *)0x0) || ((pVVar9->super_VmValue).typeID != 1))
      goto switchD_0024edc0_caseD_8;
    }
    local_150 = pVVar9;
    SmallArray<VmConstant_*,_32U>::push_back(&consts,&local_150);
  }
  switch(*(undefined4 *)&value[1]._vptr_VmValue) {
  case 7:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      uVar14 = (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    uVar14 = uVar14 ^ 8;
    if (VVar12 == VM_TYPE_DOUBLE && uVar14 == 0) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      dVar6 = (*ppVVar8)->dValue;
      goto LAB_002502ec;
    }
    if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (*ppVVar8)->lValue;
    break;
  default:
    goto switchD_0024edc0_caseD_8;
  case 0xf:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar14 = (uint)(*ppVVar8)->dValue;
    goto LAB_0024ff0a;
  case 0x10:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (ulong)(*ppVVar8)->dValue;
    break;
  case 0x11:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    pVVar9 = CreateConstantInt(module->allocator,value->source,(int)(float)(*ppVVar8)->dValue);
    pVVar9->isFloat = true;
    for (uVar14 = 0; uVar14 < (value->users).count; uVar14 = uVar14 + 1) {
      ppVVar7 = SmallArray<VmValue_*,_8U>::operator[](&value->users,uVar14);
      pVVar10 = *ppVVar7;
      if (((pVVar10 != (VmValue *)0x0) && (pVVar10->typeID == 2)) &&
         (*(int *)&pVVar10[1]._vptr_VmValue == 0x1f)) {
        ppVVar7 = SmallArray<VmValue_*,_8U>::operator[](&value->users,uVar14);
        anon_unknown.dwarf_20a43d::ReplaceValue(module,*ppVVar7,value,&pVVar9->super_VmValue);
        module->constantPropagations = module->constantPropagations + 1;
      }
    }
    (module->tempUsers).count = 0;
    goto switchD_0024edc0_caseD_8;
  case 0x12:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    dVar6 = (double)(*ppVVar8)->iValue;
    goto LAB_002502ec;
  case 0x13:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    dVar6 = (double)(*ppVVar8)->lValue;
    goto LAB_002502ec;
  case 0x14:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (ulong)(*ppVVar8)->iValue;
    break;
  case 0x15:
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar14 = (uint)(*ppVVar8)->lValue;
    goto LAB_0024ff0a;
  case 0x16:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar14 = (*ppVVar8)->iValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    iVar13 = (*ppVVar8)->iValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,2);
    iVar2 = (*ppVVar8)->iValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,3);
    uVar1 = (*ppVVar8)->iValue;
    if (uVar1 < uVar14) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,2);
      pVVar9 = CreateConstantPointer
                         (pAVar17,pSVar11,uVar1 * iVar13 + iVar2,(*ppVVar8)->container,
                          (value->type).structType,true);
      anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                (module,value,&pVVar9->super_VmValue,&module->constantPropagations);
    }
    goto switchD_0024edc0_caseD_8;
  case 0x22:
    VVar12 = (value->type).type;
    if (VVar12 != VM_TYPE_POINTER) {
      uVar14 = (value->type).size;
      if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        iVar13 = (*ppVVar8)->iValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        uVar14 = iVar13 + (*ppVVar8)->iValue;
        goto LAB_0024ff0a;
      }
      uVar14 = uVar14 ^ 8;
      if (VVar12 == VM_TYPE_DOUBLE && uVar14 == 0) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        dVar6 = dVar6 + (*ppVVar8)->dValue;
        goto LAB_002502ec;
      }
      if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar15 = lVar4 + (*ppVVar8)->lValue;
      break;
    }
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if (((*ppVVar8)->container != (VariableData *)0x0) &&
       (ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1),
       (*ppVVar8)->container != (VariableData *)0x0)) {
      __assert_fail("!(consts[0]->container && consts[1]->container)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x123e,
                    "void RunConstantPropagation(ExpressionContext &, VmModule *, VmValue *, bool)")
      ;
    }
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    iVar13 = (*ppVVar8)->iValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    iVar2 = (*ppVVar8)->iValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[]
                        (&consts,(uint)((*ppVVar8)->container == (VariableData *)0x0));
    pVVar9 = CreateConstantPointer
                       (pAVar17,pSVar11,iVar13 + iVar2,(*ppVVar8)->container,
                        (value->type).structType,true);
    goto LAB_00250402;
  case 0x23:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      uVar14 = 1;
LAB_0024f621:
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,uVar14);
      uVar14 = iVar13 - (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    uVar14 = uVar14 ^ 8;
    if (VVar12 == VM_TYPE_DOUBLE && uVar14 == 0) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      dVar6 = (*ppVVar8)->dValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      dVar6 = dVar6 - (*ppVVar8)->dValue;
      goto LAB_002502ec;
    }
    if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar16 = (*ppVVar8)->lValue;
    uVar14 = 1;
LAB_0025027e:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,uVar14);
    uVar15 = lVar16 - (*ppVVar8)->lValue;
    break;
  case 0x24:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = iVar13 * (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    uVar14 = uVar14 ^ 8;
    if (VVar12 == VM_TYPE_DOUBLE && uVar14 == 0) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      dVar6 = (*ppVVar8)->dValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      dVar6 = dVar6 * (*ppVVar8)->dValue;
      goto LAB_002502ec;
    }
    if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar4 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = lVar4 * (*ppVVar8)->lValue;
    break;
  case 0x25:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    bVar18 = IsConstantZero(&(*ppVVar8)->super_VmValue);
    if (bVar18) goto switchD_0024edc0_caseD_8;
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = iVar13 / (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    uVar14 = uVar14 ^ 8;
    if (VVar12 == VM_TYPE_DOUBLE && uVar14 == 0) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      dVar6 = (*ppVVar8)->dValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      dVar6 = dVar6 / (*ppVVar8)->dValue;
      goto LAB_002502ec;
    }
    if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar4 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = lVar4 / (*ppVVar8)->lValue;
    break;
  case 0x27:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    bVar18 = IsConstantZero(&(*ppVVar8)->super_VmValue);
    if (bVar18) goto switchD_0024edc0_caseD_8;
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = iVar13 % (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar4 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = lVar4 % (*ppVVar8)->lValue;
    break;
  case 0x28:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar19 = SBORROW4(iVar13,(*ppVVar8)->iValue);
      bVar18 = iVar13 - (*ppVVar8)->iValue < 0;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = (*ppVVar8)->dValue == dVar6;
        bVar19 = (*ppVVar8)->dValue < dVar6;
LAB_0024fc6b:
        uVar14 = (uint)(!bVar19 && !bVar18);
        goto LAB_0024ff0a;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar19 = SBORROW8(lVar4,(*ppVVar8)->lValue);
      bVar18 = lVar4 - (*ppVVar8)->lValue < 0;
    }
    uVar14 = (uint)(bVar19 != bVar18);
    goto LAB_0024ff0a;
  case 0x29:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar2 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      iVar13 = (*ppVVar8)->iValue;
      bVar20 = SBORROW4(iVar2,iVar13);
      bVar19 = iVar2 - iVar13 < 0;
      bVar18 = iVar2 == iVar13;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = dVar6 == (*ppVVar8)->dValue;
        bVar19 = dVar6 < (*ppVVar8)->dValue;
        goto LAB_0024fc6b;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      lVar5 = (*ppVVar8)->lValue;
      bVar20 = SBORROW8(lVar4,lVar5);
      bVar19 = lVar4 - lVar5 < 0;
      bVar18 = lVar4 == lVar5;
    }
    uVar14 = (uint)(!bVar18 && bVar20 == bVar19);
    goto LAB_0024ff0a;
  case 0x2a:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar2 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      iVar13 = (*ppVVar8)->iValue;
      bVar20 = SBORROW4(iVar2,iVar13);
      bVar19 = iVar2 - iVar13 < 0;
      bVar18 = iVar2 == iVar13;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = (*ppVVar8)->dValue < dVar6;
LAB_0024fd58:
        uVar14 = (uint)!bVar18;
        goto LAB_0024ff0a;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      lVar5 = (*ppVVar8)->lValue;
      bVar20 = SBORROW8(lVar4,lVar5);
      bVar19 = lVar4 - lVar5 < 0;
      bVar18 = lVar4 == lVar5;
    }
    uVar14 = (uint)(bVar18 || bVar20 != bVar19);
    goto LAB_0024ff0a;
  case 0x2b:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar19 = SBORROW4(iVar13,(*ppVVar8)->iValue);
      bVar18 = iVar13 - (*ppVVar8)->iValue < 0;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = dVar6 < (*ppVVar8)->dValue;
        goto LAB_0024fd58;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar19 = SBORROW8(lVar4,(*ppVVar8)->lValue);
      bVar18 = lVar4 - (*ppVVar8)->lValue < 0;
    }
    uVar14 = (uint)(bVar19 == bVar18);
    goto LAB_0024ff0a;
  case 0x2c:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar18 = iVar13 == (*ppVVar8)->iValue;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = dVar6 == (*ppVVar8)->dValue;
LAB_0024fa96:
        uVar14 = -(uint)bVar18 & 1;
        goto LAB_0024ff0a;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar18 = lVar4 == (*ppVVar8)->lValue;
    }
    goto LAB_0024ff06;
  case 0x2d:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar18 = iVar13 == (*ppVVar8)->iValue;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_DOUBLE) &&
         (((*ppVVar8)->super_VmValue).type.size == 8)) {
        pAVar17 = module->allocator;
        pSVar11 = value->source;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
        dVar6 = (*ppVVar8)->dValue;
        ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
        bVar18 = dVar6 != (*ppVVar8)->dValue;
        goto LAB_0024fa96;
      }
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      lVar4 = (*ppVVar8)->lValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      bVar18 = lVar4 == (*ppVVar8)->lValue;
    }
    uVar14 = (uint)!bVar18;
    goto LAB_0024ff0a;
  case 0x2e:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = iVar13 << ((byte)(*ppVVar8)->iValue & 0x1f);
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar4 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = lVar4 << ((byte)(*ppVVar8)->lValue & 0x3f);
    break;
  case 0x2f:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      iVar13 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = iVar13 >> ((byte)(*ppVVar8)->iValue & 0x1f);
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    lVar4 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = lVar4 >> ((byte)(*ppVVar8)->lValue & 0x3f);
    break;
  case 0x30:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      uVar14 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = uVar14 & (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = uVar15 & (*ppVVar8)->lValue;
    break;
  case 0x31:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      uVar14 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = uVar14 | (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = uVar15 | (*ppVVar8)->lValue;
    break;
  case 0x32:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      uVar14 = (*ppVVar8)->iValue;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
      uVar14 = uVar14 ^ (*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = (*ppVVar8)->lValue;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,1);
    uVar15 = uVar15 ^ (*ppVVar8)->lValue;
    break;
  case 0x44:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      iVar13 = 0;
      uVar14 = 0;
      goto LAB_0024f621;
    }
    uVar14 = uVar14 ^ 8;
    if (VVar12 != VM_TYPE_DOUBLE || uVar14 != 0) {
      if (VVar12 != VM_TYPE_LONG || uVar14 != 0) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      lVar16 = 0;
      uVar14 = 0;
      goto LAB_0025027e;
    }
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    dVar6 = -(*ppVVar8)->dValue;
LAB_002502ec:
    pVVar9 = CreateConstantDouble(pAVar17,pSVar11,dVar6);
    goto LAB_00250402;
  case 0x45:
    VVar12 = (value->type).type;
    uVar14 = (value->type).size;
    if (uVar14 == 4 && VVar12 == VM_TYPE_INT) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      uVar14 = ~(*ppVVar8)->iValue;
      goto LAB_0024ff0a;
    }
    if (uVar14 != 8 || VVar12 != VM_TYPE_LONG) goto switchD_0024edc0_caseD_8;
    pAVar17 = module->allocator;
    pSVar11 = value->source;
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    uVar15 = ~(*ppVVar8)->lValue;
    break;
  case 0x46:
    ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
    if ((((*ppVVar8)->super_VmValue).type.type == VM_TYPE_INT) &&
       (((*ppVVar8)->super_VmValue).type.size == 4)) {
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      bVar18 = (*ppVVar8)->iValue == 0;
    }
    else {
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      if ((((*ppVVar8)->super_VmValue).type.type != VM_TYPE_LONG) ||
         (((*ppVVar8)->super_VmValue).type.size != 8)) goto switchD_0024edc0_caseD_8;
      pAVar17 = module->allocator;
      pSVar11 = value->source;
      ppVVar8 = SmallArray<VmConstant_*,_32U>::operator[](&consts,0);
      bVar18 = (*ppVVar8)->lValue == 0;
    }
LAB_0024ff06:
    uVar14 = (uint)bVar18;
LAB_0024ff0a:
    pVVar9 = CreateConstantInt(pAVar17,pSVar11,uVar14);
    goto LAB_00250402;
  }
  pVVar9 = CreateConstantLong(pAVar17,pSVar11,uVar15);
LAB_00250402:
  anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
            (module,value,&pVVar9->super_VmValue,&module->constantPropagations);
switchD_0024edc0_caseD_8:
  SmallArray<VmConstant_*,_32U>::~SmallArray(&consts);
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}